

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<wasm::WATParser::(anonymous_namespace)::LexResult> *
wasm::WATParser::anon_unknown_0::space
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          string_view in)

{
  bool *this;
  undefined8 uVar1;
  bool bVar2;
  size_t sVar3;
  char *in_RCX;
  long lVar4;
  string_view in_00;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sVar5;
  string_view local_a8;
  undefined1 local_98 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  undefined1 local_78 [8];
  LexCtx ctx;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_1;
  LexCtx ctx_1;
  
  ctx.input._M_len = (size_t)in._M_str;
  local_78 = (undefined1  [8])in._M_len;
  ctx.input._M_str = (char *)0x0;
  this = &lexed_1.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_engaged;
  lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = __return_storage_ptr__;
  while (local_78 != (undefined1  [8])ctx.input._M_str) {
    sVar5 = LexCtx::next((LexCtx *)local_78);
    in_00._M_len = sVar5._M_str;
    in_00._M_str = in_RCX;
    spacechar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_98,
              (anon_unknown_0 *)sVar5._M_len,in_00);
    if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._8_1_ == '\x01') {
      ctx.input._M_str = ctx.input._M_str + (long)local_98;
    }
    else {
      join_0x00000010_0x00000000_ = LexCtx::next((LexCtx *)local_78);
      ctx_1.input._M_str = (char *)0x0;
      if (lexed_1.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._16_8_ < 2) {
LAB_00c00d56:
        lexed_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._8_1_ = 0;
      }
      else {
        sVar5._M_str = ";;@";
        sVar5._M_len = 3;
        sVar3 = LexCtx::startsWith((LexCtx *)this,sVar5);
        if ((sVar3 == 0) &&
           (sv._M_str = ";;", sv._M_len = 2, bVar2 = LexCtx::takePrefix((LexCtx *)this,sv), bVar2))
        {
          local_a8 = LexCtx::next((LexCtx *)this);
          std::basic_string_view<char,_std::char_traits<char>_>::find(&local_a8,'\n',0);
          LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                        &ctx.lexedSize,(LexCtx *)this);
        }
        else {
          sv_00._M_str = "(;";
          sv_00._M_len = 2;
          bVar2 = LexCtx::takePrefix((LexCtx *)this,sv_00);
          if (!bVar2) goto LAB_00c00d56;
          lVar4 = 1;
          while (lVar4 != 0) {
            if ((ulong)(lexed_1.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                        ._16_8_ - (long)ctx_1.input._M_str) < 2) {
              lexed_1.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._8_1_ = 0;
              goto LAB_00c00d8b;
            }
            sv_01._M_str = "(;";
            sv_01._M_len = 2;
            bVar2 = LexCtx::takePrefix((LexCtx *)this,sv_01);
            if (bVar2) {
              lVar4 = lVar4 + 1;
            }
            else {
              sv_02._M_str = ";)";
              sv_02._M_len = 2;
              bVar2 = LexCtx::takePrefix((LexCtx *)this,sv_02);
              if (bVar2) {
                lVar4 = lVar4 + -1;
              }
              else {
                ctx_1.input._M_str = ctx_1.input._M_str + 1;
              }
            }
          }
          LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                        &ctx.lexedSize,(LexCtx *)this);
        }
      }
LAB_00c00d8b:
      if (lexed_1.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ != '\x01') break;
      ctx.input._M_str = ctx.input._M_str + ctx.lexedSize;
    }
  }
  uVar1 = lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._16_8_;
  LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                lexed.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _16_8_,(LexCtx *)local_78);
  return (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)uVar1;
}

Assistant:

std::optional<LexResult> space(std::string_view in) {
  LexCtx ctx(in);
  while (ctx.size()) {
    if (auto lexed = spacechar(ctx.next())) {
      ctx.take(*lexed);
    } else if (auto lexed = comment(ctx.next())) {
      ctx.take(*lexed);
    } else {
      break;
    }
  }
  return ctx.lexed();
}